

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O1

int __thiscall
jsoncons::jsonpath::detail::
parent_node_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(parent_node_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  uint uVar1;
  supertype *psVar2;
  code *UNRECOVERED_JUMPTABLE;
  bool bVar3;
  bool bVar4;
  int iVar5;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar6;
  undefined4 in_register_00000034;
  
  uVar1 = this->ancestor_depth_;
  pbVar6 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)(ulong)uVar1;
  if ((int)uVar1 < 1) {
    bVar3 = true;
  }
  else {
    iVar5 = 1;
    do {
      __writefds = (fd_set *)((basic_path_node<char> *)__writefds)->parent_;
      bVar3 = (basic_path_node<char> *)__writefds != (basic_path_node<char> *)0x0;
      if ((basic_path_node<char> *)__writefds == (basic_path_node<char> *)0x0) break;
      bVar4 = iVar5 < (int)uVar1;
      iVar5 = iVar5 + 1;
    } while (bVar4);
  }
  if ((bVar3) &&
     (pbVar6 = select<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const>
                         ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                          __readfds,(basic_path_node<char> *)__writefds),
     pbVar6 != (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x0)) {
    psVar2 = (this->
             super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
             ).tail_;
    if (psVar2 == (supertype *)0x0) {
      UNRECOVERED_JUMPTABLE = *(code **)(__timeout->tv_sec + 0x10);
      iVar5 = (*UNRECOVERED_JUMPTABLE)(__timeout,__writefds,pbVar6,UNRECOVERED_JUMPTABLE);
      return iVar5;
    }
    iVar5 = (*psVar2->_vptr_jsonpath_selector[2])
                      (psVar2,CONCAT44(in_register_00000034,__nfds),__readfds,__writefds,pbVar6,
                       __timeout);
    return iVar5;
  }
  return (int)pbVar6;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
                    reference root,
                    const path_node_type& last, 
                    reference,
                    node_receiver_type& receiver,
                    result_options options) const override
        {
            const path_node_type* ancestor = std::addressof(last);
            int index = 0;
            while (ancestor != nullptr && index < ancestor_depth_)
            {
                ancestor = ancestor->parent();
                ++index;
            }

            if (ancestor != nullptr)
            {
                pointer ptr = jsoncons::jsonpath::select(root,*ancestor);
                if (ptr != nullptr)
                {
                    this->tail_select(context, root, *ancestor, *ptr, receiver, options);
                }
            }
        }